

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void updateRoutingTableForNeighbor(routerip_t *neighbor,routingtable_t *neighborRouter)

{
  _Rb_tree_node_base *__lhs;
  int iVar1;
  pointer pLVar2;
  __type _Var3;
  bool bVar4;
  _Rb_tree_node_base *__rhs;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Rb_tree_color _Var7;
  pointer __rhs_00;
  string local_50;
  
  p_Var6 = routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &routingMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    __lhs = p_Var6 + 1;
    Socket::getLocalIP_abi_cxx11_(&local_50,&socketLocal);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pLVar2 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (!_Var3) {
      __rhs = p_Var6 + 3;
      for (__rhs_00 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start; __rhs_00 != pLVar2; __rhs_00 = __rhs_00 + 1)
      {
        _Var3 = std::operator==(neighbor,&__rhs_00->neighbor);
        if (_Var3) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                   ::operator[](&routingMap_abi_cxx11_,(key_type *)__lhs);
          _Var3 = std::operator==(neighbor,&pmVar5->nextHop);
          if (_Var3) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,(key_type *)__lhs);
            Socket::getLocalIP_abi_cxx11_(&local_50,&socketLocal);
            _Var3 = std::operator==(&pmVar5->nextHop,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (_Var3) {
              std::__cxx11::string::assign((char *)__rhs);
              p_Var6[4]._M_color = 0x7fffffff;
              break;
            }
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                   ::operator[](neighborRouter,(key_type *)__lhs);
          _Var7 = 0x7fffffff;
          if (pmVar5->cost != 0x7fffffff) {
            iVar1 = __rhs_00->cost;
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,(key_type *)__lhs);
            _Var7 = iVar1 + pmVar5->cost;
          }
          _Var3 = std::operator==(neighbor,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__rhs);
          if ((_Var3) && (p_Var6[4]._M_color != _Var7)) {
            p_Var6[4]._M_color = _Var7;
            if (_Var7 == 0x7fffffff) {
              std::__cxx11::string::assign((char *)__rhs);
              p_Var6[4]._M_color = 0x7fffffff;
            }
LAB_00104097:
            tableUpdated = true;
            break;
          }
          if ((int)_Var7 < (int)p_Var6[4]._M_color) {
            Socket::getLocalIP_abi_cxx11_(&local_50,&socketLocal);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,(key_type *)__lhs);
            bVar4 = std::operator!=(&local_50,&pmVar5->nextHop);
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar4) {
              std::__cxx11::string::_M_assign((string *)__rhs);
              p_Var6[4]._M_color = _Var7;
              goto LAB_00104097;
            }
          }
        }
      }
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void updateRoutingTableForNeighbor(const routerip_t &neighbor, routingtable_t &neighborRouter) {
	for (auto &[destination, destEntry]:routingMap) {
		if (destination == socketLocal.getLocalIP()) continue;
		for (const auto &link:links) {
			if (neighbor == link.neighbor) {

				if(neighbor == routingMap[destination].nextHop && neighborRouter[destination].nextHop == socketLocal.getLocalIP()){
					// circular
					destEntry.nextHop = NONE;
					destEntry.cost = INF;
					break;
				}

				cost_t cost_via_neighbor =
						neighborRouter[destination].cost == INF ? INF : (link.cost + neighborRouter[destination].cost);
				if (neighbor == destEntry.nextHop && destEntry.cost != cost_via_neighbor) {
					// cost changed @ nextHop & neighbor is the way to reach into destination
					destEntry.cost = cost_via_neighbor;
					// || socketLocal.getLocalIP() == neighborRouter[destination].nextHop
					if (cost_via_neighbor == INF) {
						// 2nd condtn prevents circular updates for initial deactivated links
						destEntry.nextHop = NONE;
						destEntry.cost = INF;
					}
					tableUpdated = true;
					break;
				} else if (cost_via_neighbor < destEntry.cost &&
				           socketLocal.getLocalIP() != neighborRouter[destination].nextHop) {
					// take less cost not creating loop
					destEntry.nextHop = neighbor;
					destEntry.cost = cost_via_neighbor;
					tableUpdated = true;
					break;
				}
			}
		}
	}
	printUpdate();
}